

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

jh_off64_t __thiscall JetHead::File::getLength(File *this)

{
  int iVar1;
  undefined1 local_a8 [4];
  int res;
  stat64 file_status;
  File *this_local;
  
  file_status.__glibc_reserved[2] = (__syscall_slong_t)this;
  iVar1 = fstat64(this->mFd,(stat64 *)local_a8);
  if (iVar1 == -1) {
    setError(this);
    this_local = (File *)0xffffffffffffffff;
  }
  else {
    this_local = (File *)file_status.st_rdev;
  }
  return (jh_off64_t)this_local;
}

Assistant:

jh_off64_t	File::getLength() const
{
	jh_stat64_t file_status;

	int res = jh_fstat64( mFd, &file_status );

	if ( res == -1 )
	{
		setError();
		return (jh_off64_t)-1;
	}

	return file_status.st_size;
}